

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# left_right_sequence.h
# Opt level: O0

void __thiscall
bk_lib::left_right_sequence<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>,_56U>::move
          (left_right_sequence<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>,_56U> *this
          ,left_right_sequence<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>,_56U>
           *other)

{
  size_type sVar1;
  buf_type *pbVar2;
  EVP_PKEY_CTX *src;
  left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_> *in_RSI;
  left_right_sequence<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>,_56U> *in_RDI;
  bool releaseMem;
  
  releaseMem = SUB81((ulong)in_RDI >> 0x38,0);
  detail::left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>::clear
            (in_RSI,releaseMem);
  sVar1 = detail::left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>::
          raw_size(in_RSI);
  if (sVar1 < 0x21) {
    copy(in_RDI,(EVP_PKEY_CTX *)in_RSI,src);
    detail::left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>::clear
              (in_RSI,releaseMem);
  }
  else {
    (in_RDI->super_type).
    super_left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>.buf_ =
         in_RSI->buf_;
    *(uint *)&(in_RDI->super_type).
              super_left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>.
              field_0x8 =
         *(uint *)&(in_RDI->super_type).
                   super_left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>.
                   field_0x8 & 0x80000000 | *(uint *)&in_RSI->field_0x8 & 0x7fffffff;
    *(uint *)&(in_RDI->super_type).
              super_left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>.
              field_0x8 =
         *(uint *)&(in_RDI->super_type).
                   super_left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>.
                   field_0x8 & 0x7fffffff | *(uint *)&in_RSI->field_0x8 & 0x80000000;
    (in_RDI->super_type).
    super_left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>.left_ =
         in_RSI->left_;
    (in_RDI->super_type).
    super_left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>.right_ =
         in_RSI->right_;
    pbVar2 = detail::
             with_inline_buffer<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>,_32U>::
             extra((with_inline_buffer<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>,_32U>
                    *)in_RSI);
    in_RSI->buf_ = pbVar2;
    *(uint *)&in_RSI->field_0x8 = *(uint *)&in_RSI->field_0x8 & 0x80000000 | 0x20;
    *(uint *)&in_RSI->field_0x8 = *(uint *)&in_RSI->field_0x8 & 0x7fffffff;
    in_RSI->left_ = 0;
    in_RSI->right_ = 0x20;
  }
  return;
}

Assistant:

void move(left_right_sequence& other) {
		this->clear(true);
		if (other.raw_size() <= base_type::inline_raw_cap) {
			copy(other);
			other.clear(true);
		}
		else {
			this->buf_   = other.buf_;
			this->cap_   = other.cap_;
			this->free_  = other.free_;
			this->left_  = other.left_;
			this->right_ = other.right_;
			other.buf_  = other.extra();
			other.cap_  = base_type::inline_raw_cap;
			other.free_ = 0;
			other.left_ = 0;
			other.right_= base_type::inline_raw_cap;
		}
	}